

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# program.hpp
# Opt level: O0

string * format_error<char_const*&,unsigned_long&>
                   (string *__return_storage_ptr__,Options *opt,char *type,SyntaxTree *context_,
                   char *msg,char **args,unsigned_long *args_1)

{
  bool bVar1;
  __shared_ptr<SyntaxTree,_(__gnu_cxx::_Lock_policy)2> *this;
  long lVar2;
  element_type *peVar3;
  element_type *local_f8;
  TokenData local_d0;
  TokenInfo local_b8;
  undefined1 local_a0 [16];
  undefined1 local_90 [8];
  shared_ptr<const_TokenStream> tstream;
  undefined1 local_78 [16];
  __normal_iterator<const_std::shared_ptr<SyntaxTree>_*,_std::vector<std::shared_ptr<SyntaxTree>,_std::allocator<std::shared_ptr<SyntaxTree>_>_>_>
  local_68 [2];
  shared_ptr<SyntaxTree> *local_58;
  shared_ptr<SyntaxTree> *local_50;
  __normal_iterator<const_std::shared_ptr<SyntaxTree>_*,_std::vector<std::shared_ptr<SyntaxTree>,_std::allocator<std::shared_ptr<SyntaxTree>_>_>_>
  local_48;
  __normal_iterator<const_std::shared_ptr<SyntaxTree>_*,_std::vector<std::shared_ptr<SyntaxTree>,_std::allocator<std::shared_ptr<SyntaxTree>_>_>_>
  it;
  SyntaxTree *context;
  char **args_local;
  char *msg_local;
  SyntaxTree *context__local;
  char *type_local;
  Options *opt_local;
  
  it._M_current = (shared_ptr<SyntaxTree> *)context_;
  bVar1 = SyntaxTree::has_text(context_);
  if (!bVar1) {
    local_50 = (shared_ptr<SyntaxTree> *)SyntaxTree::begin((SyntaxTree *)it._M_current);
    local_58 = (shared_ptr<SyntaxTree> *)SyntaxTree::end((SyntaxTree *)it._M_current);
    local_48 = std::
               find_if<__gnu_cxx::__normal_iterator<std::shared_ptr<SyntaxTree>const*,std::vector<std::shared_ptr<SyntaxTree>,std::allocator<std::shared_ptr<SyntaxTree>>>>,format_error<char_const*&,unsigned_long&>(Options_const&,char_const*,SyntaxTree_const&,char_const*,char_const*&,unsigned_long&)::_lambda(std::shared_ptr<SyntaxTree>const&)_1_>
                         (local_50,local_58);
    local_68[0]._M_current = (shared_ptr<SyntaxTree> *)SyntaxTree::end((SyntaxTree *)it._M_current);
    bVar1 = __gnu_cxx::operator==(&local_48,local_68);
    if (bVar1) {
      local_f8 = (element_type *)it._M_current;
    }
    else {
      this = &__gnu_cxx::
              __normal_iterator<const_std::shared_ptr<SyntaxTree>_*,_std::vector<std::shared_ptr<SyntaxTree>,_std::allocator<std::shared_ptr<SyntaxTree>_>_>_>
              ::operator->(&local_48)->super___shared_ptr<SyntaxTree,_(__gnu_cxx::_Lock_policy)2>;
      local_f8 = std::__shared_ptr<SyntaxTree,_(__gnu_cxx::_Lock_policy)2>::get(this);
    }
    it._M_current = (shared_ptr<SyntaxTree> *)local_f8;
  }
  SyntaxTree::token_stream((SyntaxTree *)local_78);
  lVar2 = std::__weak_ptr<const_TokenStream,_(__gnu_cxx::_Lock_policy)2>::use_count
                    ((__weak_ptr<const_TokenStream,_(__gnu_cxx::_Lock_policy)2> *)local_78);
  std::weak_ptr<const_TokenStream>::~weak_ptr((weak_ptr<const_TokenStream> *)local_78);
  if (lVar2 == 0) {
    format_error<>(__return_storage_ptr__,opt,"fatal error",
                   "context->token_stream() == nullptr during format_error");
  }
  else {
    SyntaxTree::token_stream((SyntaxTree *)local_a0);
    std::weak_ptr<const_TokenStream>::lock((weak_ptr<const_TokenStream> *)local_90);
    std::weak_ptr<const_TokenStream>::~weak_ptr((weak_ptr<const_TokenStream> *)local_a0);
    peVar3 = std::__shared_ptr_access<const_TokenStream,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<const_TokenStream,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_90);
    SyntaxTree::get_token(&local_d0,(SyntaxTree *)it._M_current);
    TokenStream::TokenInfo::TokenInfo(&local_b8,&peVar3->text,&local_d0);
    format_error<char_const*&,unsigned_long&>
              (__return_storage_ptr__,opt,type,&local_b8,msg,args,args_1);
    std::shared_ptr<const_TokenStream>::~shared_ptr((shared_ptr<const_TokenStream> *)local_90);
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::string format_error(const Options& opt, const char* type, const SyntaxTree& context_, const char* msg, Args&&... args)
{
    const SyntaxTree* context = &context_;

    if(!context->has_text())
    {
        auto it = std::find_if(context->begin(), context->end(), [](const shared_ptr<SyntaxTree>& child) {
            return child->has_text();
        });
        context = (it == context->end())? context : it->get();
    }

    if(context->token_stream().use_count() == 0)
    {
        return format_error(opt, "fatal error", nocontext, "context->token_stream() == nullptr during format_error");
    }
    else
    {
        auto tstream = context->token_stream().lock();
        return format_error(opt, type, TokenStream::TokenInfo(tstream->text, context->get_token()), msg, std::forward<Args>(args)...);
    }
}